

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cc
# Opt level: O1

ClientMetric * __thiscall
prometheus::Histogram::Collect(ClientMetric *__return_storage_ptr__,Histogram *this)

{
  mutex *__mutex;
  vector<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
  *this_00;
  pointer *ppBVar1;
  pointer pdVar2;
  iterator __position;
  int iVar3;
  pointer pCVar4;
  ulong uVar5;
  undefined8 uVar6;
  ulong uVar7;
  double dVar8;
  undefined1 auVar9 [16];
  Bucket local_48;
  
  __mutex = &this->mutex_;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 != 0) {
    uVar6 = std::__throw_system_error(iVar3);
    ClientMetric::~ClientMetric(__return_storage_ptr__);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Unwind_Resume(uVar6);
  }
  memset(__return_storage_ptr__,0,0x90);
  (__return_storage_ptr__->info).value = 1.0;
  (__return_storage_ptr__->summary).sample_count = 0;
  (__return_storage_ptr__->summary).sample_sum = 0.0;
  (__return_storage_ptr__->summary).quantile.
  super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->summary).quantile.
  super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->summary).quantile.
  super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->histogram).sample_count = 0;
  (__return_storage_ptr__->histogram).sample_sum = 0.0;
  (__return_storage_ptr__->histogram).bucket.
  super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->histogram).bucket.
  super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->histogram).bucket.
  super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->untyped).value = 0.0;
  __return_storage_ptr__->timestamp_ms = 0;
  this_00 = &(__return_storage_ptr__->histogram).bucket;
  std::vector<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>::
  reserve(this_00,(long)(this->bucket_counts_).
                        super__Vector_base<prometheus::Counter,_std::allocator<prometheus::Counter>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->bucket_counts_).
                        super__Vector_base<prometheus::Counter,_std::allocator<prometheus::Counter>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3);
  pCVar4 = (this->bucket_counts_).
           super__Vector_base<prometheus::Counter,_std::allocator<prometheus::Counter>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->bucket_counts_).
      super__Vector_base<prometheus::Counter,_std::allocator<prometheus::Counter>_>._M_impl.
      super__Vector_impl_data._M_finish == pCVar4) {
    uVar5 = 0;
  }
  else {
    uVar7 = 0;
    uVar5 = 0;
    do {
      dVar8 = Counter::Value(pCVar4 + uVar7);
      auVar9._8_4_ = (int)(uVar5 >> 0x20);
      auVar9._0_8_ = uVar5;
      auVar9._12_4_ = 0x45300000;
      dVar8 = dVar8 + (auVar9._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0);
      uVar5 = (ulong)dVar8;
      uVar5 = (long)(dVar8 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5;
      pdVar2 = (this->bucket_boundaries_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_48.upper_bound = INFINITY;
      if (uVar7 != (long)(this->bucket_boundaries_).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pdVar2 >> 3) {
        local_48.upper_bound = pdVar2[uVar7];
      }
      __position._M_current =
           (__return_storage_ptr__->histogram).bucket.
           super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_48.cumulative_count = uVar5;
      if (__position._M_current ==
          (__return_storage_ptr__->histogram).bucket.
          super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
        ::_M_realloc_insert<prometheus::ClientMetric::Bucket>(this_00,__position,&local_48);
      }
      else {
        (__position._M_current)->cumulative_count = uVar5;
        (__position._M_current)->upper_bound = local_48.upper_bound;
        ppBVar1 = &(__return_storage_ptr__->histogram).bucket.
                   super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppBVar1 = *ppBVar1 + 1;
      }
      uVar7 = uVar7 + 1;
      pCVar4 = (this->bucket_counts_).
               super__Vector_base<prometheus::Counter,_std::allocator<prometheus::Counter>_>._M_impl
               .super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(this->bucket_counts_).
                                   super__Vector_base<prometheus::Counter,_std::allocator<prometheus::Counter>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar4 >> 3));
  }
  (__return_storage_ptr__->histogram).sample_count = uVar5;
  dVar8 = Gauge::Value(&this->sum_);
  (__return_storage_ptr__->histogram).sample_sum = dVar8;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return __return_storage_ptr__;
}

Assistant:

ClientMetric Histogram::Collect() const {
  std::lock_guard<std::mutex> lock(mutex_);

  auto metric = ClientMetric{};

  auto cumulative_count = 0ULL;
  metric.histogram.bucket.reserve(bucket_counts_.size());
  for (std::size_t i{0}; i < bucket_counts_.size(); ++i) {
    cumulative_count += bucket_counts_[i].Value();
    auto bucket = ClientMetric::Bucket{};
    bucket.cumulative_count = cumulative_count;
    bucket.upper_bound = (i == bucket_boundaries_.size()
                              ? std::numeric_limits<double>::infinity()
                              : bucket_boundaries_[i]);
    metric.histogram.bucket.push_back(std::move(bucket));
  }
  metric.histogram.sample_count = cumulative_count;
  metric.histogram.sample_sum = sum_.Value();

  return metric;
}